

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.h
# Opt level: O2

Source * __thiscall
Hpipe::Pool<Hpipe::Source,32>::New<char_const(&)[22],char(&)[6897],bool>
          (Pool<Hpipe::Source,32> *this,char (*args) [22],char (*args_1) [6897],bool *args_2)

{
  void *pvVar1;
  int iVar2;
  Source *this_00;
  
  iVar2 = *(int *)(this + 8);
  if (iVar2 == 0x20) {
    pvVar1 = operator_new(0x408);
    *(undefined8 *)((long)pvVar1 + 0x400) = *(undefined8 *)this;
    *(void **)this = pvVar1;
    iVar2 = 0;
  }
  else {
    pvVar1 = *(void **)this;
  }
  *(int *)(this + 8) = iVar2 + 1;
  this_00 = (Source *)((long)iVar2 * 0x20 + (long)pvVar1);
  Source::Source(this_00,*args,*args_1,*args_2);
  return this_00;
}

Assistant:

T *New( Args&&... args ) {
        if ( used == s ) {
            Set *n = new Set;
            n->prev = last;
            last = n;
            used = 0;
        }
        return new ( last->items + sizeof( T ) * used++ ) T( std::forward<Args>( args )... );
    }